

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O2

bool __thiscall QSplitter::event(QSplitter *this,QEvent *e)

{
  ushort uVar1;
  QSplitterPrivate *this_00;
  bool bVar2;
  
  this_00 = *(QSplitterPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  uVar1 = *(ushort *)(e + 8);
  if (1 < uVar1 - 0x1a) {
    if (uVar1 == 0x11) {
      if ((*(uint *)&this_00->field_0x2a4 >> 8 & 1) == 0) goto LAB_00449102;
      *(uint *)&this_00->field_0x2a4 = *(uint *)&this_00->field_0x2a4 & 0xffff00ff;
    }
    else if (uVar1 != 0x4c) {
      if ((uVar1 == 0x12) && ((*(uint *)&this_00->field_0x2a4 >> 8 & 1) == 0)) {
        *(uint *)&this_00->field_0x2a4 = *(uint *)&this_00->field_0x2a4 & 0xffff00ff | 0x100;
      }
      goto LAB_00449102;
    }
  }
  QSplitterPrivate::recalc
            (this_00,SUB21((ushort)(short)((this->super_QFrame).super_QWidget.data)->
                                          widget_attributes >> 0xf,0));
LAB_00449102:
  bVar2 = QFrame::event(&this->super_QFrame,e);
  return bVar2;
}

Assistant:

bool QSplitter::event(QEvent *e)
{
    Q_D(QSplitter);
    switch (e->type()) {
    case QEvent::Hide:
        // Reset firstShow to false here since things can be done to the splitter in between
        if (!d->firstShow)
            d->firstShow = true;
        break;
    case QEvent::Show:
        if (!d->firstShow)
            break;
        d->firstShow = false;
        Q_FALLTHROUGH();
    case QEvent::HideToParent:
    case QEvent::ShowToParent:
    case QEvent::LayoutRequest:
        d->recalc(isVisible());
        break;
    default:
        ;
    }
    return QFrame::event(e);
}